

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void __thiscall
SingleNodeColumnSampler<long_double,_float>::restore
          (SingleNodeColumnSampler<long_double,_float> *this,
          SingleNodeColumnSampler<long_double,_float> *other)

{
  bool bVar1;
  pointer pdVar2;
  size_t *psVar3;
  pointer pdVar4;
  const_reference cVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong uVar8;
  size_t col_1;
  reference rVar9;
  
  this->n_inf = other->n_inf;
  uVar7 = other->n_left;
  this->n_left = uVar7;
  bVar1 = other->using_tree;
  this->using_tree = bVar1;
  if (bVar1 == true) {
    std::vector<double,std::allocator<double>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
              ((vector<double,std::allocator<double>> *)&this->tree_weights,
               (other->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               (other->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->mapped_inf_indices,
               (other->mapped_inf_indices).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               (other->mapped_inf_indices).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish);
    return;
  }
  this->cumw = other->cumw;
  if (this->backup_weights == true) {
    pdVar2 = (other->weights_own).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    psVar3 = this->col_indices;
    pdVar4 = (this->weights_own).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      pdVar4[psVar3[uVar8]] = pdVar2[uVar8];
    }
  }
  if (((long)(this->inifinite_weights).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
      (long)(this->inifinite_weights).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
      (ulong)(this->inifinite_weights).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset != 0) {
    for (uVar8 = 0; uVar8 < uVar7; uVar8 = uVar8 + 1) {
      cVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](&other->inifinite_weights,uVar8);
      rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (&this->inifinite_weights,this->col_indices[uVar8]);
      puVar6 = rVar9._M_p;
      if (cVar5) {
        uVar7 = rVar9._M_mask | *puVar6;
      }
      else {
        uVar7 = ~rVar9._M_mask & *puVar6;
      }
      *puVar6 = uVar7;
      uVar7 = this->n_left;
    }
  }
  return;
}

Assistant:

void SingleNodeColumnSampler<ldouble_safe, real_t>::restore(const SingleNodeColumnSampler &other)
{
    this->n_inf = other.n_inf;
    this->n_left = other.n_left;
    this->using_tree = other.using_tree;

    if (this->using_tree)
    {
        this->tree_weights.assign(other.tree_weights.begin(), other.tree_weights.end());
        this->mapped_inf_indices.assign(other.mapped_inf_indices.begin(), other.mapped_inf_indices.end());
    }

    else
    {
        this->cumw = other.cumw;
        if (this->backup_weights)
        {
            for (size_t col = 0; col < this->n_left; col++)
                this->weights_own[this->col_indices[col]] = other.weights_own[col];
        }

        if (this->inifinite_weights.size())
        {
            for (size_t col = 0; col < this->n_left; col++)
                this->inifinite_weights[this->col_indices[col]] = other.inifinite_weights[col];
        }
    }
}